

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcre2_serialize.c
# Opt level: O0

int32_t pcre2_serialize_decode_16
                  (pcre2_code_16 **codes,int32_t number_of_codes,uint8_t *bytes,
                  pcre2_general_context_16 *gcontext)

{
  ulong size;
  uint8_t *__dest;
  pcre2_code_16 *ppVar1;
  pcre2_compile_context_16 *local_70;
  size_t blocksize;
  int32_t j;
  int32_t i;
  uint8_t *tables;
  pcre2_real_code_16 *dst_re;
  uint8_t *src_bytes;
  pcre2_memctl *memctl;
  pcre2_serialized_data *data;
  pcre2_general_context_16 *gcontext_local;
  uint8_t *bytes_local;
  int32_t number_of_codes_local;
  pcre2_code_16 **codes_local;
  
  local_70 = (pcre2_compile_context_16 *)gcontext;
  if (gcontext == (pcre2_general_context_16 *)0x0) {
    local_70 = &_pcre2_default_compile_context_16;
  }
  if ((bytes == (uint8_t *)0x0) || (codes == (pcre2_code_16 **)0x0)) {
    codes_local._4_4_ = -0x33;
  }
  else if (number_of_codes < 1) {
    codes_local._4_4_ = -0x1d;
  }
  else if (*(int *)(bytes + 0xc) < 1) {
    codes_local._4_4_ = -0x3e;
  }
  else if (*(int *)bytes == 0x50523253) {
    if (*(int *)(bytes + 4) == 0x20000a) {
      if (*(int *)(bytes + 8) == 0x80802) {
        bytes_local._4_4_ = number_of_codes;
        if (*(int *)(bytes + 0xc) < number_of_codes) {
          bytes_local._4_4_ = *(int *)(bytes + 0xc);
        }
        __dest = (uint8_t *)(*(local_70->memctl).malloc)(0x448,(local_70->memctl).memory_data);
        if (__dest == (uint8_t *)0x0) {
          codes_local._4_4_ = -0x30;
        }
        else {
          memcpy(__dest,bytes + 0x10,0x440);
          *(long *)(__dest + 0x440) = (long)bytes_local._4_4_;
          dst_re = (pcre2_real_code_16 *)(bytes + 0x450);
          for (blocksize._4_4_ = 0; blocksize._4_4_ < bytes_local._4_4_;
              blocksize._4_4_ = blocksize._4_4_ + 1) {
            size = dst_re->blocksize;
            if (size < 0x89) {
              return -0x3e;
            }
            ppVar1 = (pcre2_code_16 *)_pcre2_memctl_malloc_16(size,&gcontext->memctl);
            if (ppVar1 == (pcre2_code_16 *)0x0) {
              (*(local_70->memctl).free)(__dest,(local_70->memctl).memory_data);
              for (blocksize._0_4_ = 0; (int)blocksize < blocksize._4_4_;
                  blocksize._0_4_ = (int)blocksize + 1) {
                (*(local_70->memctl).free)(codes[(int)blocksize],(local_70->memctl).memory_data);
                codes[(int)blocksize] = (pcre2_code_16 *)0x0;
              }
              return -0x30;
            }
            memcpy(&ppVar1->tables,&dst_re->tables,size - 0x18);
            if (((ppVar1->magic_number != 0x50435245) || (0x22 < ppVar1->name_entry_size)) ||
               (10000 < ppVar1->name_count)) {
              (*(local_70->memctl).free)(ppVar1,(local_70->memctl).memory_data);
              return -0x3e;
            }
            ppVar1->tables = __dest;
            ppVar1->executable_jit = (void *)0x0;
            ppVar1->flags = ppVar1->flags | 0x40000;
            codes[blocksize._4_4_] = ppVar1;
            dst_re = (pcre2_real_code_16 *)(dst_re->start_bitmap + (size - 0x28));
          }
          codes_local._4_4_ = bytes_local._4_4_;
        }
      }
      else {
        codes_local._4_4_ = -0x20;
      }
    }
    else {
      codes_local._4_4_ = -0x20;
    }
  }
  else {
    codes_local._4_4_ = -0x1f;
  }
  return codes_local._4_4_;
}

Assistant:

PCRE2_CALL_CONVENTION
pcre2_serialize_decode(pcre2_code **codes, int32_t number_of_codes,
   const uint8_t *bytes, pcre2_general_context *gcontext)
{
const pcre2_serialized_data *data = (const pcre2_serialized_data *)bytes;
const pcre2_memctl *memctl = (gcontext != NULL) ?
  &gcontext->memctl : &PRIV(default_compile_context).memctl;

const uint8_t *src_bytes;
pcre2_real_code *dst_re;
uint8_t *tables;
int32_t i, j;

/* Sanity checks. */

if (data == NULL || codes == NULL) return PCRE2_ERROR_NULL;
if (number_of_codes <= 0) return PCRE2_ERROR_BADDATA;
if (data->number_of_codes <= 0) return PCRE2_ERROR_BADSERIALIZEDDATA;
if (data->magic != SERIALIZED_DATA_MAGIC) return PCRE2_ERROR_BADMAGIC;
if (data->version != SERIALIZED_DATA_VERSION) return PCRE2_ERROR_BADMODE;
if (data->config != SERIALIZED_DATA_CONFIG) return PCRE2_ERROR_BADMODE;

if (number_of_codes > data->number_of_codes)
  number_of_codes = data->number_of_codes;

src_bytes = bytes + sizeof(pcre2_serialized_data);

/* Decode tables. The reference count for the tables is stored immediately
following them. */

tables = memctl->malloc(tables_length + sizeof(PCRE2_SIZE), memctl->memory_data);
if (tables == NULL) return PCRE2_ERROR_NOMEMORY;

memcpy(tables, src_bytes, tables_length);
*(PCRE2_SIZE *)(tables + tables_length) = number_of_codes;
src_bytes += tables_length;

/* Decode the byte stream. We must not try to read the size from the compiled
code block in the stream, because it might be unaligned, which causes errors on
hardware such as Sparc-64 that doesn't like unaligned memory accesses. The type
of the blocksize field is given its own name to ensure that it is the same here
as in the block. */

for (i = 0; i < number_of_codes; i++)
  {
  CODE_BLOCKSIZE_TYPE blocksize;
  memcpy(&blocksize, src_bytes + offsetof(pcre2_real_code, blocksize),
    sizeof(CODE_BLOCKSIZE_TYPE));
  if (blocksize <= sizeof(pcre2_real_code))
    return PCRE2_ERROR_BADSERIALIZEDDATA;

  /* The allocator provided by gcontext replaces the original one. */

  dst_re = (pcre2_real_code *)PRIV(memctl_malloc)(blocksize,
    (pcre2_memctl *)gcontext);
  if (dst_re == NULL)
    {
    memctl->free(tables, memctl->memory_data);
    for (j = 0; j < i; j++)
      {
      memctl->free(codes[j], memctl->memory_data);
      codes[j] = NULL;
      }
    return PCRE2_ERROR_NOMEMORY;
    }

  /* The new allocator must be preserved. */

  memcpy(((uint8_t *)dst_re) + sizeof(pcre2_memctl),
    src_bytes + sizeof(pcre2_memctl), blocksize - sizeof(pcre2_memctl));
  if (dst_re->magic_number != MAGIC_NUMBER ||
      dst_re->name_entry_size > MAX_NAME_SIZE + IMM2_SIZE + 1 ||
      dst_re->name_count > MAX_NAME_COUNT)
    {   
    memctl->free(dst_re, memctl->memory_data); 
    return PCRE2_ERROR_BADSERIALIZEDDATA;
    } 

  /* At the moment only one table is supported. */

  dst_re->tables = tables;
  dst_re->executable_jit = NULL;
  dst_re->flags |= PCRE2_DEREF_TABLES;

  codes[i] = dst_re;
  src_bytes += blocksize;
  }

return number_of_codes;
}